

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle_p.h
# Opt level: O0

bool __thiscall
QCommonStylePrivate::isViewItemCached(QCommonStylePrivate *this,QStyleOptionViewItem *option)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint uVar5;
  uint uVar6;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_39 = false;
  if (*(long *)(in_RDI + 200) != 0) {
    uVar5 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (*(long *)(in_RSI + 0x78) == *(long *)(*(long *)(in_RDI + 200) + 0x78)) {
      bVar2 = ::operator==((QModelIndex *)
                           (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) &
                           0xffffffffffffff),
                           (QModelIndex *)
                           CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      uVar4 = uVar5 & 0xffffff;
      uVar5 = uVar4;
      if (bVar2) {
        bVar2 = ::operator==((QFlagsStorageHelper<QStyle::StateFlag,_4>)
                             ((QFlagsStorageHelper<QStyle::StateFlag,_4> *)(in_RSI + 8))->
                             super_QFlagsStorage<QStyle::StateFlag>,
                             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
                             ((QFlagsStorageHelper<QStyle::StateFlag,_4> *)
                             (*(long *)(in_RDI + 200) + 8))->super_QFlagsStorage<QStyle::StateFlag>)
        ;
        uVar6 = uVar4 & 0xffffff;
        uVar5 = uVar6;
        if (bVar2) {
          bVar2 = ::operator==((QRect *)(CONCAT44(uVar4,in_stack_ffffffffffffffb0) &
                                        0xffffffffffffff),
                               (QRect *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8
                                                ));
          uVar4 = uVar6 & 0xffffff;
          uVar5 = uVar4;
          if (bVar2) {
            bVar2 = ::operator==((QString *)
                                 (CONCAT44(uVar6,in_stack_ffffffffffffffb0) & 0xffffffffffffff),
                                 (QString *)
                                 CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            uVar5 = 0;
            if ((bVar2) &&
               (uVar5 = uVar4 & 0xffffff,
               *(int *)(in_RSI + 0xc) == *(int *)(*(long *)(in_RDI + 200) + 0xc))) {
              bVar2 = ::operator==((QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                                   ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(in_RSI + 0x40))->
                                   super_QFlagsStorage<Qt::AlignmentFlag>,
                                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                                   ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)
                                   (*(long *)(in_RDI + 200) + 0x40))->
                                   super_QFlagsStorage<Qt::AlignmentFlag>);
              uVar4 = uVar5 & 0xffffff;
              uVar5 = uVar4;
              if (bVar2) {
                bVar2 = ::operator==((QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                                     ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(in_RSI + 0x44))
                                     ->super_QFlagsStorage<Qt::AlignmentFlag>,
                                     (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                                     ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)
                                     (*(long *)(in_RDI + 200) + 0x44))->
                                     super_QFlagsStorage<Qt::AlignmentFlag>);
                uVar5 = 0;
                if ((bVar2) &&
                   (uVar5 = 0, *(int *)(in_RSI + 0x4c) == *(int *)(*(long *)(in_RDI + 200) + 0x4c)))
                {
                  bVar2 = ::operator==((QSize *)(CONCAT44(uVar4,in_stack_ffffffffffffffb0) &
                                                0xffffffffffffff),
                                       (QSize *)CONCAT17(in_stack_ffffffffffffffaf,
                                                         in_stack_ffffffffffffffa8));
                  uVar5 = 0;
                  if (bVar2) {
                    bVar2 = ::operator==((QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                          )((QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                             *)(in_RSI + 0x6c))->
                                           super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>
                                         ,(QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                           )((QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                              *)(*(long *)(in_RDI + 200) + 0x6c))->
                                            super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>
                                        );
                    uVar5 = 0;
                    if (bVar2) {
                      bVar3 = QIcon::isNull();
                      uVar4 = (uint)(bVar3 & 1);
                      bVar3 = QIcon::isNull();
                      uVar5 = 0;
                      if (uVar4 == (bVar3 & 1)) {
                        uVar4 = QFont::operator==((QFont *)(in_RSI + 0x58),
                                                  (QFont *)(*(long *)(in_RDI + 200) + 0x58));
                        uVar5 = 0;
                        if (((uVar4 & 1) != 0) &&
                           (uVar5 = 0,
                           *(int *)(in_RSI + 0xc0) == *(int *)(*(long *)(in_RDI + 200) + 0xc0))) {
                          uVar5 = (uint)((*(byte *)(in_RSI + 0x68) & 1) ==
                                        (*(byte *)(*(long *)(in_RDI + 200) + 0x68) & 1)) << 0x18;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_39 = SUB41(uVar5 >> 0x18,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool isViewItemCached(const QStyleOptionViewItem &option) const {
        return cachedOption && (option.widget == cachedOption->widget
               && option.index == cachedOption->index
               && option.state == cachedOption->state
               && option.rect == cachedOption->rect
               && option.text == cachedOption->text
               && option.direction == cachedOption->direction
               && option.displayAlignment == cachedOption->displayAlignment
               && option.decorationAlignment == cachedOption->decorationAlignment
               && option.decorationPosition == cachedOption->decorationPosition
               && option.decorationSize == cachedOption->decorationSize
               && option.features == cachedOption->features
               && option.icon.isNull() == cachedOption->icon.isNull()
               && option.font == cachedOption->font
               && option.viewItemPosition == cachedOption->viewItemPosition
               && option.showDecorationSelected == cachedOption->showDecorationSelected);
    }